

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPSegment.hpp
# Opt level: O1

void __thiscall CppJieba::MPSegment::~MPSegment(MPSegment *this)

{
  ~MPSegment(this);
  operator_delete(this);
  return;
}

Assistant:

MPSegment(const char * const dictPath): _dictPath(dictPath){}